

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

void Abc_ManResubCollectDivs_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vInternal)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  void **ppvVar6;
  int in_EDX;
  int Fill;
  
  pAVar4 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar5 = pNode->pNtk;
  iVar2 = pAVar5->nTravIds;
  if ((pAVar4->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar5->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar5->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar5->vTravIds).pArray[iVar1] = iVar2;
    Abc_ManResubCollectDivs_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vInternal);
    Abc_ManResubCollectDivs_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vInternal);
    if ((pNode->field_0x14 & 0x10) == 0) {
      uVar3 = vInternal->nSize;
      if (uVar3 == vInternal->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vInternal->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vInternal->pArray,0x80);
          }
          vInternal->pArray = ppvVar6;
          vInternal->nCap = 0x10;
        }
        else {
          if (vInternal->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vInternal->pArray,(ulong)uVar3 << 4);
          }
          vInternal->pArray = ppvVar6;
          vInternal->nCap = uVar3 * 2;
        }
      }
      else {
        ppvVar6 = vInternal->pArray;
      }
      iVar1 = vInternal->nSize;
      vInternal->nSize = iVar1 + 1;
      ppvVar6[iVar1] = pNode;
    }
  }
  return;
}

Assistant:

void Abc_ManResubCollectDivs_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vInternal )
{
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // collect the fanins
    Abc_ManResubCollectDivs_rec( Abc_ObjFanin0(pNode), vInternal );
    Abc_ManResubCollectDivs_rec( Abc_ObjFanin1(pNode), vInternal );
    // collect the internal node
    if ( pNode->fMarkA == 0 ) 
        Vec_PtrPush( vInternal, pNode );
}